

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_70c7b9::HandleSublistCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  string *name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view separator;
  string_view value;
  int length;
  int start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sublist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  int local_100;
  int local_fc;
  undefined1 local_f8 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined1 local_a8 [32];
  char local_88 [8];
  char *local_80;
  pointer local_78;
  pointer pbStack_70;
  undefined1 local_68 [48];
  string local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pbVar2 - (long)pbVar1;
  if (lVar4 != 0xa0) {
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_f8,(lVar4 >> 5) - 1);
    local_a8._0_8_ = (pointer)0x2d;
    local_a8._8_8_ = "sub-command SUBLIST requires four arguments (";
    local_a8._16_8_ = local_f8._0_8_;
    local_a8._24_8_ = local_f8._8_8_;
    local_88[0] = '\b';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_80 = " found).";
    views._M_len = 3;
    views._M_array = (iterator)local_a8;
    cmCatViews_abi_cxx11_((string *)local_68,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    return false;
  }
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = GetList(&local_c8,pbVar1 + 1,status->Makefile);
  name = pbVar2 + -1;
  if ((!bVar3) ||
     (local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar3 = true;
    cmMakefile::AddDefinition(status->Makefile,name,(string_view)(ZEXT816(0x6e77f9) << 0x40));
    goto LAB_0021e0ed;
  }
  bVar3 = GetIndexArg((args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 2,&local_fc,status->Makefile);
  if (bVar3) {
    bVar3 = GetIndexArg((args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 3,&local_100,status->Makefile);
    if (!bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_a8._24_8_ = pbVar1[3]._M_dataplus._M_p;
      local_a8._16_8_ = pbVar1[3]._M_string_length;
      local_a8._0_8_ = (char *)0x7;
      local_a8._8_8_ = "index: ";
      local_88[0] = '\x15';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_80 = " is not a valid index";
      views_01._M_len = 3;
      views_01._M_array = (iterator)local_a8;
      cmCatViews_abi_cxx11_((string *)local_f8,views_01);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0021e0d0;
    }
    uVar6 = (ulong)local_fc;
    if (((long)uVar6 < 0) ||
       (uVar7 = (long)local_c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5, uVar7 <= uVar6)) {
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_68,local_fc);
      local_a8._0_8_ = (char *)0xd;
      local_a8._8_8_ = "begin index: ";
      local_a8._16_8_ = local_68._0_8_;
      local_a8._24_8_ = local_68._8_8_;
      local_88[0] = '\x15';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_80 = " is out of range 0 - ";
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)local_f8,
                 ((long)local_c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
      local_78 = (pointer)local_f8._0_8_;
      pbStack_70 = (pointer)local_f8._8_8_;
      views_02._M_len = 4;
      views_02._M_array = (iterator)local_a8;
      cmCatViews_abi_cxx11_(&local_38,views_02);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      local_f8._16_8_ = local_38.field_2._M_allocated_capacity;
      local_f8._0_8_ = local_38._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) goto LAB_0021e0eb;
      goto LAB_0021e0e3;
    }
    if (-2 < local_100) {
      uVar5 = (ulong)(uint)(local_100 + local_fc);
      if (uVar7 < (uint)(local_100 + local_fc)) {
        uVar5 = uVar7;
      }
      if (local_100 == -1) {
        uVar5 = uVar7;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_f8,
                 local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar6,
                 local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,(allocator_type *)local_a8);
      this = status->Makefile;
      separator._M_str = ";";
      separator._M_len = 1;
      cmJoin((string *)local_a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8,separator,(string_view)ZEXT816(0));
      value._M_str = (char *)local_a8._0_8_;
      value._M_len = local_a8._8_8_;
      cmMakefile::AddDefinition(this,name,value);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      bVar3 = true;
      goto LAB_0021e0ed;
    }
    local_a8._0_8_ = (char *)0x8;
    local_a8._8_8_ = "length: ";
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_f8,local_100);
    cmStrCat<char[25]>((string *)local_68,(cmAlphaNum *)local_a8,(cmAlphaNum *)local_f8,
                       (char (*) [25])" should be -1 or greater");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_f8._16_8_ = local_68._16_8_;
    local_f8._0_8_ = local_68._0_8_;
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) goto LAB_0021e0e3;
  }
  else {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_a8._24_8_ = pbVar1[2]._M_dataplus._M_p;
    local_a8._16_8_ = pbVar1[2]._M_string_length;
    local_a8._0_8_ = (char *)0x7;
    local_a8._8_8_ = "index: ";
    local_88[0] = '\x15';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_80 = " is not a valid index";
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_a8;
    cmCatViews_abi_cxx11_((string *)local_f8,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0021e0d0:
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
LAB_0021e0e3:
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
  }
LAB_0021e0eb:
  bVar3 = false;
LAB_0021e0ed:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return bVar3;
}

Assistant:

bool HandleSublistCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError(cmStrCat("sub-command SUBLIST requires four arguments (",
                             args.size() - 1, " found)."));
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();

  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, listName, status.GetMakefile()) ||
      varArgsExpanded.empty()) {
    status.GetMakefile().AddDefinition(variableName, "");
    return true;
  }

  int start;
  int length;
  if (!GetIndexArg(args[2], &start, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[2], " is not a valid index"));
    return false;
  }
  if (!GetIndexArg(args[3], &length, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[3], " is not a valid index"));
    return false;
  }

  using size_type = decltype(varArgsExpanded)::size_type;

  if (start < 0 || static_cast<size_type>(start) >= varArgsExpanded.size()) {
    status.SetError(cmStrCat("begin index: ", start, " is out of range 0 - ",
                             varArgsExpanded.size() - 1));
    return false;
  }
  if (length < -1) {
    status.SetError(cmStrCat("length: ", length, " should be -1 or greater"));
    return false;
  }

  const size_type end =
    (length == -1 ||
     static_cast<size_type>(start + length) > varArgsExpanded.size())
    ? varArgsExpanded.size()
    : static_cast<size_type>(start + length);
  std::vector<std::string> sublist(varArgsExpanded.begin() + start,
                                   varArgsExpanded.begin() + end);
  status.GetMakefile().AddDefinition(variableName, cmJoin(sublist, ";"));
  return true;
}